

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O3

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::uploadImage
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkImage image,VkImageLayout layout,
          TextureLevelPyramid *data)

{
  VkImageViewType VVar1;
  int iVar2;
  int iVar3;
  VkImageViewType VVar4;
  int iVar5;
  VkResult VVar6;
  pointer pPVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  uint local_314;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copySlices;
  VkCommandBuffer local_2b8;
  long *plStack_2b0;
  deUint32 local_2a8;
  undefined4 uStack_2a4;
  undefined8 uStack_2a0;
  ConstPixelBufferAccess srcAccess;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_268;
  VkSubmitInfo submitInfo;
  Move<vk::Handle<(vk::HandleType)8>_> local_210;
  TextureFormat local_1f0;
  deUint64 local_1e8;
  undefined8 local_1e0;
  int local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  TextureFormat local_1c8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1c0;
  VkQueue local_1a0;
  ulong local_198;
  void *local_190;
  VkFence local_188;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_180;
  VkCommandPool local_168;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_160;
  undefined4 local_148 [2];
  undefined8 local_140;
  undefined8 local_138;
  undefined4 local_130;
  VkImageLayout local_12c;
  undefined8 local_128;
  deUint64 local_120;
  undefined8 local_118;
  int local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_100 [2];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  TextureFormat local_e0;
  undefined8 local_d8;
  ulong local_d0;
  VkCommandBufferBeginInfo cmdBufBeginInfo;
  PixelBufferAccess dstAccess;
  VkCommandPoolCreateInfo cmdPoolCreateInfo;
  VkBufferCreateInfo bufferCreateInfo;
  
  VVar1 = this->m_viewType;
  if (VVar1 == VK_IMAGE_VIEW_TYPE_3D) {
    local_314 = 1;
  }
  else if (VVar1 == VK_IMAGE_VIEW_TYPE_CUBE) {
    local_314 = 0xc;
  }
  else {
    local_314 = 2;
    if (VVar1 == VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) {
      local_314 = 0xc;
    }
  }
  pPVar7 = (data->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_1a0 = queue;
  if ((int)((ulong)((long)(data->m_access).
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) >> 3) *
      -0x33333333 < 1) {
    uVar10 = 0;
  }
  else {
    lVar12 = 0;
    lVar15 = 0;
    uVar9 = 0;
    do {
      local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
           *(deUint64 *)(pPVar7 + lVar15);
      lVar8 = 2;
      do {
        *(undefined4 *)
         ((long)&local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal +
         lVar8 * 4) = *(undefined4 *)
                       ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar8 * 4 + lVar12 + -8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      lVar8 = 5;
      do {
        *(undefined4 *)
         ((long)&local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal +
         lVar8 * 4) = *(undefined4 *)
                       ((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data +
                       lVar8 * 4 + lVar12 + -8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      local_1f0 = ((TextureFormat *)(pPVar7 + lVar15))[4];
      iVar11 = local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface.
               _4_4_ * (int)local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                            m_deviceIface *
               (int)local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
      iVar3 = tcu::TextureFormat::getPixelSize((TextureFormat *)&local_210);
      uVar9 = uVar9 + iVar3 * iVar11;
      lVar15 = lVar15 + 1;
      pPVar7 = (data->m_access).
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x28;
    } while (lVar15 < (int)((ulong)((long)(data->m_access).
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7)
                           >> 3) * -0x33333333);
    uVar10 = (ulong)uVar9;
  }
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 0;
  bufferCreateInfo.usage = 1;
  bufferCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  bufferCreateInfo.size = uVar10;
  ::vk::createBuffer(&local_210,vki,device,&bufferCreateInfo,(VkAllocationCallbacks *)0x0);
  DStack_1c0.m_device =
       local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  DStack_1c0.m_allocator =
       local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_1c8.order =
       (ChannelOrder)
       local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  local_1c8.type =
       local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._4_4_;
  DStack_1c0.m_deviceIface =
       local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  allocateAndBindObjectMemory
            (&local_268,vki,device,allocator,
             (VkBuffer)
             local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  local_100[0] = 0x2c;
  local_f8 = 0;
  local_f0 = 0x80000004000;
  uStack_e8 = 0xffffffffffffffff;
  local_e0 = local_1c8;
  local_d8 = 0;
  local_1d8 = (int)((ulong)((long)(data->m_access).
                                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(data->m_access).
                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333;
  local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ = 0x2d;
  local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x100000000000;
  local_210.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x700000000;
  local_1f0.order = ~R;
  local_1f0.type = ~SNORM_INT8;
  local_1e8 = image.m_internal;
  local_1e0 = 1;
  local_1d4 = 0;
  local_1d0 = local_314;
  local_148[0] = 0x2d;
  local_140 = 0;
  local_138 = 0x2000001000;
  local_130 = 7;
  local_12c = layout;
  local_128 = 0xffffffffffffffff;
  local_120 = image.m_internal;
  local_118 = 1;
  local_10c = 0;
  local_108 = local_314;
  cmdPoolCreateInfo.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolCreateInfo.pNext = (void *)0x0;
  cmdPoolCreateInfo.flags = 1;
  local_198 = uVar10;
  local_110 = local_1d8;
  local_d0 = uVar10;
  cmdPoolCreateInfo.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vki,device,&cmdPoolCreateInfo,
             (VkAllocationCallbacks *)0x0);
  DStack_160.m_device = (VkDevice)submitInfo._16_8_;
  local_168.m_internal = submitInfo._0_8_;
  DStack_160.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  cmdBufBeginInfo.flags = 1;
  cmdBufBeginInfo._20_4_ = 0;
  cmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufBeginInfo._4_4_ = 0;
  cmdBufBeginInfo.pNext = (void *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vki,device,(VkCommandPool)submitInfo._0_8_
             ,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uStack_2a0 = CONCAT44(submitInfo.pWaitSemaphores._4_4_,(int)submitInfo.pWaitSemaphores);
  local_2a8 = submitInfo.waitSemaphoreCount;
  uStack_2a4 = submitInfo._20_4_;
  local_2b8 = (VkCommandBuffer)submitInfo._0_8_;
  plStack_2b0 = (long *)submitInfo.pNext;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vki,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_180.m_device = (VkDevice)submitInfo._16_8_;
  local_188.m_internal = submitInfo._0_8_;
  DStack_180.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar1 = this->m_viewType;
  VVar4 = VVar1 & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY;
  if (VVar4 == VK_IMAGE_VIEW_TYPE_1D) {
    local_314 = (((data->m_access).
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).m_size.
                m_data[1];
    goto LAB_00510a0c;
  }
  if (VVar4 != VK_IMAGE_VIEW_TYPE_2D) {
    if (VVar1 == VK_IMAGE_VIEW_TYPE_3D) {
      local_314 = 1;
      goto LAB_00510a0c;
    }
    if ((VVar1 != VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) && (VVar1 != VK_IMAGE_VIEW_TYPE_CUBE)) {
      local_314 = 0;
      goto LAB_00510a0c;
    }
  }
  local_314 = (((data->m_access).
                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
                _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).m_size.
              m_data[2];
LAB_00510a0c:
  pPVar7 = (data->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(data->m_access).
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7) >> 3) *
          -0x33333333) {
    local_190 = (local_268.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                 m_data.ptr)->m_hostPtr;
    lVar12 = 0;
    lVar15 = 0;
    uVar9 = 0;
    do {
      srcAccess.m_format = *(TextureFormat *)(pPVar7 + lVar15);
      lVar8 = 2;
      do {
        srcAccess.m_size.m_data[lVar8 + -2] =
             *(int *)((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar8 * 4 + lVar12 + -8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 5);
      lVar8 = 5;
      do {
        srcAccess.m_size.m_data[lVar8 + -2] =
             *(int *)((long)(pPVar7->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar8 * 4 + lVar12 + -8);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 8);
      srcAccess.m_data = *(void **)((TextureFormat *)(pPVar7 + lVar15) + 4);
      tcu::PixelBufferAccess::PixelBufferAccess
                (&dstAccess,&srcAccess.m_format,&srcAccess.m_size,&srcAccess.m_pitch,
                 (void *)((long)local_190 + (ulong)uVar9));
      iVar2 = srcAccess.m_size.m_data[2];
      iVar13 = srcAccess.m_size.m_data[1];
      iVar3 = srcAccess.m_size.m_data[0];
      iVar5 = tcu::TextureFormat::getPixelSize(&srcAccess.m_format);
      iVar11 = srcAccess.m_size.m_data[0];
      uVar14 = iVar2 * iVar5 * iVar13 * iVar3;
      iVar3 = 1;
      if (VVar4 != VK_IMAGE_VIEW_TYPE_1D) {
        iVar3 = srcAccess.m_size.m_data[1];
      }
      iVar13 = 1;
      if (VVar1 == VK_IMAGE_VIEW_TYPE_3D) {
        iVar13 = srcAccess.m_size.m_data[2];
      }
      if (0 < (int)local_314) {
        uVar10 = 0;
        do {
          submitInfo.pWaitSemaphores._0_4_ = (int)uVar10;
          submitInfo._0_8_ =
               (ulong)((uVar14 / local_314) * (int)submitInfo.pWaitSemaphores) + (ulong)uVar9;
          submitInfo.pNext = (void *)CONCAT44(iVar3,iVar11);
          submitInfo._20_4_ = (int)lVar15;
          submitInfo.waitSemaphoreCount = 1;
          submitInfo.pWaitSemaphores._4_4_ = 1;
          submitInfo.pWaitDstStageMask._0_4_ = 0;
          submitInfo.pWaitDstStageMask._4_4_ = 0;
          submitInfo.commandBufferCount = 0;
          submitInfo._44_4_ = iVar11;
          submitInfo.pCommandBuffers = (VkCommandBuffer *)CONCAT44(iVar13,iVar3);
          if (copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
            _M_realloc_insert<vk::VkBufferImageCopy_const&>
                      ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>> *)
                       &copySlices,
                       (iterator)
                       copySlices.
                       super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(VkBufferImageCopy *)&submitInfo);
          }
          else {
            *(VkCommandBuffer **)
             &((copySlices.
                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                _M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
                 submitInfo.pCommandBuffers;
            ((copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = 0;
            ((copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = 0;
            *(ulong *)&((copySlices.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
                 (ulong)(uint)iVar11 << 0x20;
            ((copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask = 1;
            ((copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel = (int)lVar15;
            ((copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).baseArrayLayer =
                 (int)submitInfo.pWaitSemaphores;
            ((copySlices.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount = 1;
            (copySlices.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_finish)->bufferOffset = submitInfo._0_8_;
            *(void **)&(copySlices.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
                 submitInfo.pNext;
            copySlices.
            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 copySlices.
                 super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar10 = uVar10 + 1;
        } while (local_314 != uVar10);
      }
      tcu::copy((EVP_PKEY_CTX *)&dstAccess,(EVP_PKEY_CTX *)&srcAccess);
      uVar9 = uVar9 + uVar14;
      lVar15 = lVar15 + 1;
      pPVar7 = (data->m_access).
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x28;
    } while (lVar15 < (int)((ulong)((long)(data->m_access).
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7)
                           >> 3) * -0x33333333);
  }
  ::vk::flushMappedMemoryRange
            (vki,device,
             (VkDeviceMemory)
             ((local_268.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
               m_data.ptr)->m_memory).m_internal,
             (local_268.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
             .ptr)->m_offset,local_198);
  VVar6 = (*vki->_vptr_DeviceInterface[0x49])(vki,local_2b8,&cmdBufBeginInfo);
  ::vk::checkResult(VVar6,"vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe2b);
  (*vki->_vptr_DeviceInterface[0x6d])(vki,local_2b8,1,0x1000,0,0,0,1,local_100,1,&local_210);
  (*vki->_vptr_DeviceInterface[0x62])
            (vki,local_2b8,local_1c8,image.m_internal,7,
             (ulong)(uint)((int)((ulong)((long)copySlices.
                                               super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)copySlices.
                                              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x49249249),
             copySlices.
             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (*vki->_vptr_DeviceInterface[0x6d])(vki,local_2b8,0x1000,1,0,0,0,0,0,1,local_148);
  VVar6 = (*vki->_vptr_DeviceInterface[0x4a])(vki,local_2b8);
  ::vk::checkResult(VVar6,"vki.endCommandBuffer(*cmd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe35);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask._0_4_ = 0;
  submitInfo.pWaitDstStageMask._4_4_ = 0;
  submitInfo._44_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores._0_4_ = 0;
  submitInfo.pWaitSemaphores._4_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo.pCommandBuffers = &local_2b8;
  VVar6 = (*vki->_vptr_DeviceInterface[2])(vki,local_1a0,1,&submitInfo,local_188.m_internal);
  ::vk::checkResult(VVar6,"vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe45);
  VVar6 = (*vki->_vptr_DeviceInterface[0x16])(vki,device,1,&local_188,0,0xffffffffffffffff);
  ::vk::checkResult(VVar6,
                    "vki.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                    ,0xe47);
  if (copySlices.super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(copySlices.
                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)copySlices.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)copySlices.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_180,local_188);
  }
  if (local_2b8 != (VkCommandBuffer)0x0) {
    submitInfo._0_8_ = local_2b8;
    (**(code **)(*plStack_2b0 + 0x240))(plStack_2b0,_local_2a8,uStack_2a0,1);
  }
  if (local_168.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_160,local_168);
  }
  if (local_268.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(local_268.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
  }
  if (local_1c8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_1c0,(VkBuffer)local_1c8);
  }
  return;
}

Assistant:

void ImageInstanceImages::uploadImage (const vk::DeviceInterface&		vki,
									   vk::VkDevice						device,
									   deUint32							queueFamilyIndex,
									   vk::VkQueue						queue,
									   vk::Allocator&					allocator,
									   vk::VkImage						image,
									   vk::VkImageLayout				layout,
									   const tcu::TextureLevelPyramid&	data)
{
	const deUint32						arraySize					= (m_viewType == vk::VK_IMAGE_VIEW_TYPE_3D) ? (1) :
																	  (m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE || m_viewType == vk::VK_IMAGE_VIEW_TYPE_CUBE_ARRAY) ? (6 * (deUint32)ARRAY_SIZE) :
																	  ((deUint32)ARRAY_SIZE);
	const deUint32						dataBufferSize				= getTextureLevelPyramidDataSize(data);
	const vk::VkBufferCreateInfo		bufferCreateInfo			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,
		DE_NULL,
		0u,													// flags
		dataBufferSize,										// size
		vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT,				// usage
		vk::VK_SHARING_MODE_EXCLUSIVE,						// sharingMode
		0u,													// queueFamilyCount
		DE_NULL,											// pQueueFamilyIndices
	};
	const vk::Unique<vk::VkBuffer>		dataBuffer					(vk::createBuffer(vki, device, &bufferCreateInfo));
	const de::MovePtr<vk::Allocation>	dataBufferMemory			= allocateAndBindObjectMemory(vki, device, allocator, *dataBuffer, vk::MemoryRequirement::HostVisible);
	const vk::VkBufferMemoryBarrier		preMemoryBarrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_HOST_WRITE_BIT,						// outputMask
		vk::VK_ACCESS_TRANSFER_READ_BIT,					// inputMask
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		*dataBuffer,										// buffer
		0u,													// offset
		dataBufferSize,										// size
	};
	const vk::VkImageSubresourceRange	fullSubrange				=
	{
		vk::VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
		0u,													// baseMipLevel
		(deUint32)data.getNumLevels(),						// mipLevels
		0u,													// baseArraySlice
		arraySize,											// arraySize
	};
	const vk::VkImageMemoryBarrier		preImageBarrier				=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		0u,													// outputMask
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// inputMask
		vk::VK_IMAGE_LAYOUT_UNDEFINED,						// oldLayout
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// newLayout
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		image,												// image
		fullSubrange										// subresourceRange
	};
	const vk::VkImageMemoryBarrier		postImageBarrier			=
	{
		vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
		DE_NULL,
		vk::VK_ACCESS_TRANSFER_WRITE_BIT,					// outputMask
		vk::VK_ACCESS_SHADER_READ_BIT,						// inputMask
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// oldLayout
		layout,												// newLayout
		VK_QUEUE_FAMILY_IGNORED,							// srcQueueFamilyIndex
		VK_QUEUE_FAMILY_IGNORED,							// destQueueFamilyIndex
		image,												// image
		fullSubrange										// subresourceRange
	};
	const vk::VkCommandPoolCreateInfo		cmdPoolCreateInfo			=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
		DE_NULL,
		vk::VK_COMMAND_POOL_CREATE_TRANSIENT_BIT,			// flags
		queueFamilyIndex,									// queueFamilyIndex
	};
	const vk::Unique<vk::VkCommandPool>		cmdPool						(vk::createCommandPool(vki, device, &cmdPoolCreateInfo));
	const vk::VkCommandBufferBeginInfo		cmdBufBeginInfo				=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		vk::VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// flags
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	const vk::Unique<vk::VkCommandBuffer>	cmd							(vk::allocateCommandBuffer(vki, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::Unique<vk::VkFence>			cmdCompleteFence			(vk::createFence(vki, device));
	const deUint64							infiniteTimeout				= ~(deUint64)0u;
	std::vector<vk::VkBufferImageCopy>		copySlices;

	// copy data to buffer
	writeTextureLevelPyramidData(dataBufferMemory->getHostPtr(), dataBufferSize, data, m_viewType , &copySlices);
	flushMappedMemoryRange(vki, device, dataBufferMemory->getMemory(), dataBufferMemory->getOffset(), dataBufferSize);

	// record command buffer
	VK_CHECK(vki.beginCommandBuffer(*cmd, &cmdBufBeginInfo));
	vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
						   0, (const vk::VkMemoryBarrier*)DE_NULL,
						   1, &preMemoryBarrier,
						   1, &preImageBarrier);
	vki.cmdCopyBufferToImage(*cmd, *dataBuffer, image, vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copySlices.size(), &copySlices[0]);
	vki.cmdPipelineBarrier(*cmd, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
						   0, (const vk::VkMemoryBarrier*)DE_NULL,
						   0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
						   1, &postImageBarrier);
	VK_CHECK(vki.endCommandBuffer(*cmd));

	// submit and wait for command buffer to complete before killing it
	{
		const vk::VkSubmitInfo	submitInfo	=
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
			DE_NULL,
			0u,
			(const vk::VkSemaphore*)0,
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,
			&cmd.get(),
			0u,
			(const vk::VkSemaphore*)0,
		};
		VK_CHECK(vki.queueSubmit(queue, 1, &submitInfo, *cmdCompleteFence));
	}
	VK_CHECK(vki.waitForFences(device, 1, &cmdCompleteFence.get(), 0u, infiniteTimeout)); // \note: timeout is failure
}